

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_fastpfor.cpp
# Opt level: O0

void __thiscall FastPForLib::FastPForTest::SetUp(FastPForTest *this)

{
  undefined1 uVar1;
  bool bVar2;
  ParamType *pPVar3;
  FastPFor<4U> *this_00;
  undefined8 *puVar4;
  logic_error *this_01;
  long in_RDI;
  string name;
  pointer in_stack_ffffffffffffff58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff60;
  uint32_t in_stack_ffffffffffffff7c;
  uint32_t pageSize;
  FastPFor<8U> *in_stack_ffffffffffffff80;
  undefined5 in_stack_ffffffffffffffa0;
  undefined1 uVar5;
  char *in_stack_ffffffffffffffa8;
  string local_28 [40];
  
  pPVar3 = testing::
           WithParamInterface<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           ::GetParam();
  std::__cxx11::string::string(local_28,(string *)pPVar3);
  uVar1 = std::operator==(in_stack_ffffffffffffff60,(char *)in_stack_ffffffffffffff58);
  if ((bool)uVar1) {
    this_00 = (FastPFor<4U> *)(in_RDI + 0x18);
    operator_new(0x78);
    FastPFor<4U>::FastPFor(this_00,in_stack_ffffffffffffff7c);
    std::unique_ptr<FastPForLib::IntegerCODEC,_std::default_delete<FastPForLib::IntegerCODEC>_>::
    reset((unique_ptr<FastPForLib::IntegerCODEC,_std::default_delete<FastPForLib::IntegerCODEC>_> *)
          in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
  }
  else {
    bVar2 = std::operator==(in_stack_ffffffffffffff60,(char *)in_stack_ffffffffffffff58);
    pageSize = CONCAT13(bVar2,(int3)in_stack_ffffffffffffff7c);
    if (!bVar2) {
      uVar5 = 1;
      puVar4 = (undefined8 *)__cxa_allocate_exception(8);
      this_01 = (logic_error *)operator_new(0x10);
      std::operator+(in_stack_ffffffffffffffa8,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT17(1,CONCAT16(uVar5,CONCAT15(uVar1,in_stack_ffffffffffffffa0))));
      std::logic_error::logic_error(this_01,(string *)&stack0xffffffffffffffa8);
      *puVar4 = this_01;
      __cxa_throw(puVar4,&std::logic_error*::typeinfo,0);
    }
    operator_new(0x78);
    FastPFor<8U>::FastPFor(in_stack_ffffffffffffff80,pageSize);
    std::unique_ptr<FastPForLib::IntegerCODEC,_std::default_delete<FastPForLib::IntegerCODEC>_>::
    reset((unique_ptr<FastPForLib::IntegerCODEC,_std::default_delete<FastPForLib::IntegerCODEC>_> *)
          in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
  }
  std::__cxx11::string::~string(local_28);
  return;
}

Assistant:

virtual void SetUp() {
        std::string name = GetParam();
        if (name == "FastPFor128") {
          codec.reset(new FastPFor<4>());
        } else if (name == "FastPFor256") {
          codec.reset(new FastPFor<8>());
        } else {
          throw new std::logic_error("Unknown codec " + name);
        }
      }